

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.cpp
# Opt level: O0

void __thiscall
btBox2dShape::calculateLocalInertia(btBox2dShape *this,btScalar mass,btVector3 *inertia)

{
  btScalar *pbVar1;
  btBox2dShape *in_RSI;
  float in_XMM0_Da;
  btScalar lz;
  btScalar ly;
  btScalar lx;
  btVector3 halfExtents;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  btVector3 local_28;
  
  local_28 = getHalfExtentsWithMargin(in_RSI);
  pbVar1 = btVector3::x(&local_28);
  local_2c = *pbVar1 * 2.0;
  pbVar1 = btVector3::y(&local_28);
  local_30 = *pbVar1 * 2.0;
  pbVar1 = btVector3::z(&local_28);
  local_34 = *pbVar1 * 2.0;
  local_38 = (in_XMM0_Da / 12.0) * (local_30 * local_30 + local_34 * local_34);
  local_3c = (in_XMM0_Da / 12.0) * (local_2c * local_2c + local_34 * local_34);
  local_40 = (in_XMM0_Da / 12.0) * (local_2c * local_2c + local_30 * local_30);
  btVector3::setValue((btVector3 *)in_RSI,&local_38,&local_3c,&local_40);
  return;
}

Assistant:

void	btBox2dShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//btScalar margin = btScalar(0.);
	btVector3 halfExtents = getHalfExtentsWithMargin();

	btScalar lx=btScalar(2.)*(halfExtents.x());
	btScalar ly=btScalar(2.)*(halfExtents.y());
	btScalar lz=btScalar(2.)*(halfExtents.z());

	inertia.setValue(mass/(btScalar(12.0)) * (ly*ly + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + ly*ly));

}